

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O3

void __thiscall QHstsCache::updateFromHeaders(QHstsCache *this,QHttpHeaders *headers,QUrl *url)

{
  QDateTime *this_00;
  char cVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QDateTime aQStack_98 [8];
  QString local_90;
  undefined1 local_78 [56];
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QUrl::isValid();
  if (cVar1 != '\0') {
    this_00 = (QDateTime *)(local_78 + 0x30);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = (QArrayData *)0x0;
    local_78._8_8_ = (char *)0x0;
    local_78._16_8_ = 0;
    local_78._24_8_ = (QArrayData *)0x0;
    local_78._32_8_ = (char *)0x0;
    local_78._40_8_ = 0;
    QDateTime::QDateTime(this_00);
    puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffff0000000000);
    local_38 = (undefined1 *)0x0;
    puStack_30 = (undefined1 *)((ulong)puStack_30 & 0xffffffffffffff00);
    bVar2 = QHstsHeaderParser::parse((QHstsHeaderParser *)local_78,headers);
    if (bVar2) {
      QUrl::host(&local_90,url,0x7f00000);
      QDateTime::QDateTime(aQStack_98,this_00);
      updateKnownHost(this,&local_90,aQStack_98,puStack_30._0_1_);
      QDateTime::~QDateTime(aQStack_98);
      if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (this->hstsStore != (QHstsStore *)0x0) {
        QHstsStore::synchronize(this->hstsStore);
      }
    }
    QDateTime::~QDateTime(this_00);
    if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._24_8_,1,0x10);
      }
    }
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHstsCache::updateFromHeaders(const QHttpHeaders &headers,
                                   const QUrl &url)
{
    if (!url.isValid())
        return;

    QHstsHeaderParser parser;
    if (parser.parse(headers)) {
        updateKnownHost(url.host(), parser.expirationDate(), parser.includeSubDomains());
#if QT_CONFIG(settings)
        if (hstsStore)
            hstsStore->synchronize();
#endif // QT_CONFIG(settings)
    }
}